

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O0

bool __thiscall FListMenuItemPlayerDisplay::UpdatePlayerClass(FListMenuItemPlayerDisplay *this)

{
  bool bVar1;
  uint uVar2;
  FListMenuItem **ppFVar3;
  FName local_20;
  int local_1c;
  FName seltype;
  int classnum;
  FListMenuItemPlayerDisplay *this_local;
  
  if (this->mOwner->mSelectedItem < 0) {
    this_local._7_1_ = false;
  }
  else {
    _seltype = this;
    ppFVar3 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                        (&(this->mOwner->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>,
                         (long)this->mOwner->mSelectedItem);
    (*(*ppFVar3)->_vptr_FListMenuItem[7])(&local_20,*ppFVar3,&local_1c);
    bVar1 = FName::operator!=(&local_20,NAME_Episodemenu);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      uVar2 = TArray<FPlayerClass,_FPlayerClass>::Size(&PlayerClasses);
      if (uVar2 == 0) {
        this_local._7_1_ = false;
      }
      else {
        SetPlayerClass(this,local_1c,false);
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FListMenuItemPlayerDisplay::UpdatePlayerClass()
{
	if (mOwner->mSelectedItem >= 0)
	{
		int classnum;
		FName seltype = mOwner->mItems[mOwner->mSelectedItem]->GetAction(&classnum);

		if (seltype != NAME_Episodemenu) return false;
		if (PlayerClasses.Size() == 0) return false;

		SetPlayerClass(classnum);
		return true;
	}
	return false;
}